

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O3

void nhdp_domain_mpr_remove(nhdp_domain_mpr *mpr)

{
  list_entity *plVar1;
  
  plVar1 = &_domain_list;
  do {
    plVar1 = plVar1->next;
    if (plVar1->prev == _domain_list.prev) goto LAB_00129895;
  } while ((nhdp_domain_mpr *)plVar1[-0x28].prev != mpr);
  _remove_mpr((nhdp_domain *)(plVar1 + -0x2a));
LAB_00129895:
  avl_remove(&_domain_mprs,&mpr->_node);
  return;
}

Assistant:

void
nhdp_domain_mpr_remove(struct nhdp_domain_mpr *mpr) {
  struct nhdp_domain *domain;

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->mpr == mpr) {
      _remove_mpr(domain);
      break;
    }
  }

  avl_remove(&_domain_mprs, &mpr->_node);
}